

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* Scine::Core::Detail::split(string *s,char delimiter)

{
  bool bVar1;
  value_type *__x;
  char in_DL;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string item;
  stringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elements;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  string local_1d0 [48];
  stringstream local_1a0 [398];
  byte local_12;
  char local_11;
  
  local_12 = 0;
  this = in_RDI;
  local_11 = in_DL;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13655a);
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__cxx11::stringstream::str((string *)local_1a0);
  std::__cxx11::string::string(local_1d0);
  while( true ) {
    __x = (value_type *)
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_1a0,local_1d0,local_11);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)(&__x->_M_dataplus + *(long *)(*(long *)__x + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this,__x);
  }
  local_12 = 1;
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  if ((local_12 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
  }
  return in_RDI;
}

Assistant:

inline std::vector<std::string> split(const std::string& s, char delimiter) {
  std::vector<std::string> elements;

  std::stringstream ss;
  ss.str(s);
  std::string item;

  while (std::getline(ss, item, delimiter)) {
    elements.push_back(item);
  }

  return elements;
}